

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O2

void __thiscall
nuraft::raft_server::pause_state_machine_exeuction(raft_server *this,size_t timeout_ms)

{
  element_type *peVar1;
  int iVar2;
  uint64_t uVar3;
  char *pcVar4;
  char *pcVar5;
  string local_80;
  timer_helper timer;
  
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pcVar5 = "ACTIVE";
      if (((this->sm_commit_paused_)._M_base._M_i & 1U) != 0) {
        pcVar5 = "PAUSED";
      }
      pcVar4 = "SLEEPING";
      if (((this->sm_commit_exec_in_progress_)._M_base._M_i & 1U) != 0) {
        pcVar4 = "RUNNING";
      }
      msg_if_given_abi_cxx11_
                ((string *)&timer,
                 "pause state machine execution, previously %s, state machine %s, timeout %zu ms",
                 pcVar5,pcVar4,timeout_ms);
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"pause_state_machine_exeuction",0x375,&timer);
      std::__cxx11::string::~string((string *)&timer);
    }
  }
  LOCK();
  (this->sm_commit_paused_)._M_base._M_i = true;
  UNLOCK();
  if (timeout_ms != 0) {
    timer_helper::timer_helper(&timer,0,false);
    wait_for_state_machine_pause(this,timeout_ms);
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 != (element_type *)0x0) {
      iVar2 = (*peVar1->_vptr_logger[7])();
      if (3 < iVar2) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar3 = timer_helper::get_ms(&timer);
        pcVar5 = "SLEEPING";
        if (((this->sm_commit_exec_in_progress_)._M_base._M_i & 1U) != 0) {
          pcVar5 = "RUNNING";
        }
        msg_if_given_abi_cxx11_(&local_80,"waited %lu ms, state machine %s",uVar3,pcVar5);
        (*peVar1->_vptr_logger[8])
                  (peVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"pause_state_machine_exeuction",0x380,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
      }
    }
  }
  return;
}

Assistant:

void raft_server::pause_state_machine_exeuction(size_t timeout_ms) {
    p_in( "pause state machine execution, previously %s, state machine %s, "
          "timeout %zu ms",
          sm_commit_paused_ ? "PAUSED" : "ACTIVE",
          sm_commit_exec_in_progress_ ? "RUNNING" : "SLEEPING",
          timeout_ms );
    sm_commit_paused_ = true;

    if (!timeout_ms) {
        return;
    }

    timer_helper timer;
    wait_for_state_machine_pause(timeout_ms);
    p_in( "waited %" PRIu64 " ms, state machine %s",
          timer.get_ms(),
          sm_commit_exec_in_progress_ ? "RUNNING" : "SLEEPING" );
}